

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::MethodDescriptorProto(MethodDescriptorProto *this)

{
  Arena *in_RDI;
  Message *in_stack_ffffffffffffffd0;
  MethodDescriptorProto *in_stack_ffffffffffffffe0;
  
  Message::Message(in_stack_ffffffffffffffd0);
  *(undefined ***)in_RDI = &PTR__MethodDescriptorProto_0089a130;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)(in_RDI + 8),in_RDI);
  memset(in_RDI + 0x10,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x68aaae);
  SharedCtor(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

MethodDescriptorProto::MethodDescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.MethodDescriptorProto)
}